

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShapeTests.cpp
# Opt level: O1

int testShapeRange(void)

{
  ostream *poVar1;
  ShapeRange r3;
  ShapeRange r1;
  ShapeRange r5;
  ShapeRange r30;
  ShapeRange r6;
  ShapeRange r2;
  ShapeRange r36;
  ShapeRange r29;
  ShapeRange r26;
  ShapeRange r20;
  ShapeRange r16;
  ShapeRange r7;
  ShapeRange r32;
  ShapeRange r31;
  ShapeRange r35;
  ShapeRange r27;
  ShapeRange r11;
  ShapeRange r24;
  ShapeRange r23;
  ShapeRange r22;
  ShapeRange r18;
  ShapeRange r17;
  ShapeRange r14;
  ShapeRange r13;
  ShapeRange r12;
  ShapeRange r10;
  ShapeRange r9;
  ShapeRange r8;
  ShapeRange r33;
  ShapeRange r34;
  ShapeRange r21;
  ShapeRange r4;
  ShapeRange SStack_468;
  ShapeRange local_448;
  ShapeRange local_428 [2];
  RangeValue local_3e8 [2];
  ShapeRange local_3c8 [6];
  RangeValue local_308 [42];
  ShapeRange local_60 [2];
  
  CoreML::ShapeRange::ShapeRange(&local_448);
  CoreML::ShapeRange::ShapeRange(local_3c8,10);
  CoreML::ShapeRange::ShapeRange(&SStack_468,8,0x14);
  CoreML::RangeValue::RangeValue(&local_428[0]._minimum,9);
  CoreML::RangeValue::RangeValue(local_3e8);
  CoreML::ShapeRange::ShapeRange(local_60,&local_428[0]._minimum,local_3e8);
  CoreML::RangeValue::RangeValue(local_3e8);
  CoreML::RangeValue::RangeValue(local_308);
  CoreML::ShapeRange::ShapeRange(local_428,local_3e8,local_308);
  CoreML::ShapeRange::isValid(local_428,2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNShapeTests.cpp"
             ,100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xeb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": error: ",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"0",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," was false, expected true.",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 1;
}

Assistant:

int testShapeRange() {

    ShapeRange r1 = ShapeRange();
    ShapeRange r2 = ShapeRange(10);
    ShapeRange r3 = ShapeRange(8, 20);
    ShapeRange r4 = ShapeRange(RangeValue(9), RangeValue());

    bool catch_me = false;
    try {
        ShapeRange r5 = ShapeRange(RangeValue(), RangeValue());
        r5.isValid(2);
        ML_ASSERT(0);
    }
    catch (std::runtime_error& err) {
        ML_ASSERT(1);
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    ML_ASSERT(r1.isValid(5));
    ML_ASSERT(r1.isValid(RangeValue()));
    ML_ASSERT(!(r3.isValid(5)));
    ML_ASSERT(r4.isValid(RangeValue()));

    ML_ASSERT(r1.minimum().value() == 0);
    ML_ASSERT(r2.maximum().isUnbound());

    ShapeRange r5 = r1 + 2;
    ML_ASSERT(r5.minimum().value() == 2);
    ML_ASSERT(r5.maximum().isUnbound());

    ShapeRange r6 = r3 + 3;
    ML_ASSERT(r6.minimum().value() == 11);
    ML_ASSERT(r6.maximum().value() == 23);

    ShapeRange r7 = r1 * 5;
    ML_ASSERT(r7.minimum().value() == 0);
    ML_ASSERT(r7.maximum().isUnbound());

    ShapeRange r8 = r3 * 4;
    ML_ASSERT(r8.minimum().value() == 32);
    ML_ASSERT(r8.maximum().value() == 80);

    // These can throw for making the range invalid
    ShapeRange r9 = r1 - 10;
    ML_ASSERT(r9.minimum().value() == 0);
    ML_ASSERT(r9.maximum().isUnbound());

    ShapeRange r10 = r2 - 9;
    ML_ASSERT(r10.minimum().value() == 1);
    ML_ASSERT(r10.maximum().isUnbound());

    ShapeRange r11 = r3 - 22;
    ML_ASSERT(r11.minimum().value() == 0);
    ML_ASSERT(r11.maximum().value() == 0);
    ML_ASSERT(!r11.isValid(10));

    ShapeRange r12 = r2 - (-3);
    ML_ASSERT(r12.minimum().value() == 13);
    ML_ASSERT(r12.maximum().isUnbound());

    ShapeRange r13 = r1 / size_t(10);
    ML_ASSERT(r13.minimum().value() == 0);
    ML_ASSERT(r13.maximum().isUnbound());

    // integer division
    ShapeRange r14 = r3 / size_t(3);
    ML_ASSERT(r14.minimum().value() == 2);
    ML_ASSERT(r14.maximum().value() == 6);

    catch_me = false;
    try {
        ShapeRange r15 = r3 / size_t(0);
        ML_ASSERT(0);
        ML_ASSERT(r15.isValid(1));
    }
    catch (std::runtime_error& err) {
        ML_ASSERT(1);
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    ML_ASSERT(r1.isValid(0));
    ML_ASSERT(r1.isValid(1000));
    ML_ASSERT(r1.isValid(RangeValue()));
    ML_ASSERT(r3.isValid(20));
    ML_ASSERT(!r3.isValid(21));
    ML_ASSERT(r3.isValid(8));
    ML_ASSERT(!r3.isValid(7));

    ShapeRange r16 = r1 + r3;
    ML_ASSERT(r16.minimum().value() == 8);
    ML_ASSERT(r16.maximum().isUnbound());

    ShapeRange r17 = r3 + r3;
    ML_ASSERT(r17.minimum().value() == 16);
    ML_ASSERT(r17.maximum().value() == 40);

    ShapeRange r18 = r1 - r3;
    ML_ASSERT(r18.minimum().value() == 0);
    ML_ASSERT(r18.maximum().isUnbound());

    catch_me = false;
    try {
        ShapeRange r19 = r3 - r1;
        ML_ASSERT(r19.isValid(0));
    }
    catch (const std::runtime_error& err) {
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    ShapeRange r20 = ShapeRange(4, 7);
    ShapeRange r21 = r3 - r20;
    ML_ASSERT(r21.minimum().value() == 1);
    ML_ASSERT(r21.maximum().value() == 16);

    ShapeRange r22 = r1 * r3;
    ML_ASSERT(r22.minimum().value() == 0);
    ML_ASSERT(r22.maximum().isUnbound());

    ShapeRange r23 = r1 / r3;
    ML_ASSERT(r23.minimum().value() == 0);
    ML_ASSERT(r23.maximum().isUnbound());

    ShapeRange r24 = r3 / r20;
    ML_ASSERT(r24.minimum().value() == 1);
    ML_ASSERT(r24.maximum().value() == 5);

    catch_me = false;
    try {
        ShapeRange r25 = r3 / r1;
        ML_ASSERT(r25.minimum().isUnbound());
    }
    catch (std::runtime_error& err) {
        catch_me = true;
    }
    ML_ASSERT(catch_me);

//    ShapeRange intersect(const ShapeRange& other) const;

    ShapeRange r26 = r1.intersect(r2);
    ML_ASSERT(r26.minimum().value() == 10);
    ML_ASSERT(r26.maximum().isUnbound());

    ShapeRange r27 = r2.intersect(r3);
    ML_ASSERT(r27.minimum().value() == 10);
    ML_ASSERT(r27.maximum().value() == 20);

    catch_me = false;
    try {
        ShapeRange r28 = r3.intersect(ShapeRange(3, 6));
        ML_ASSERT(r28.minimum().isUnbound());
    }
    catch (std::runtime_error& err) {
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    ShapeRange r29 = r1.unify(r2);
    ML_ASSERT(r29.minimum().value() == 0);
    ML_ASSERT(r29.maximum().isUnbound());

    ShapeRange r30 = r3.unify(ShapeRange(25, 30));
    ML_ASSERT(r30.minimum().value() == 8);
    ML_ASSERT(r30.maximum().value() == 30);

    ShapeRange r31 = r1;
    r31.setValue(10);
    ML_ASSERT(r31.minimum().value() == 10);
    ML_ASSERT(r31.maximum().value() == 10);

    ShapeRange r32 = r1;
    catch_me = false;
    try {
        r32.setValue(RangeValue());
    }
    catch (std::runtime_error& err) {
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    ShapeRange r33 = r3;
    catch_me = false;
    try {
        r33.setLower(2);
    }
    catch (std::runtime_error& err) {
        catch_me = true;
    }
    ML_ASSERT(catch_me);

    ShapeRange r34 = ShapeRange().intersect(ShapeRange());
    ML_ASSERT(r34.minimum().value() == 0);
    ML_ASSERT(r34.maximum().isUnbound());

    ShapeRange r35 = ShapeRange(1, 1).intersect(ShapeRange());
    ML_ASSERT(r35.minimum().value() == 1);
    ML_ASSERT(r35.maximum().value() == 1);

    ShapeRange r36 = ShapeRange().intersect(ShapeRange(10));
    ML_ASSERT(r36.minimum().value() == 10);
    ML_ASSERT(r36.maximum().isUnbound());
    
    return 0;

}